

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

QString * QRegularExpression::anchoredPattern(QStringView expression)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>,_QLatin1String>
  local_68;
  QStringView local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.a.b = &local_20;
  local_68.a.a.a.d.d = (Data *)0x0;
  local_68.a.a.a.d.ptr = (char16_t *)0x0;
  local_68.a.a.a.d.size = 0;
  local_68.a.a.b.m_size = 5;
  local_68.a.a.b.m_data = "\\A(?:";
  local_68.b.m_size = 3;
  local_68.b.m_data = ")\\z";
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>,_QLatin1String>
  ::convertTo<QString>(in_RDI,&local_68);
  if (&(local_68.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QRegularExpression::anchoredPattern(QStringView expression)
{
    return QString()
           + "\\A(?:"_L1
           + expression
           + ")\\z"_L1;
}